

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O3

bool MixerContext::sane_layout(cubeb_channel_layout layout)

{
  uint uVar1;
  
  if (((((layout & 7) != 0) && (uVar1 = (layout & 3) - 1, (layout & 3 ^ uVar1) <= uVar1)) &&
      (uVar1 = (layout & 0x600) - 1, (layout & 0x600 ^ uVar1) <= uVar1)) &&
     (uVar1 = (layout & 0x30) - 1, (layout & 0x30 ^ uVar1) <= uVar1)) {
    uVar1 = (layout & 0xc0) - 1;
    return layout != 0xffffffff && (layout & 0xc0 ^ uVar1) <= uVar1;
  }
  return false;
}

Assistant:

static bool sane_layout(cubeb_channel_layout layout)
  {
    if (!(layout & CUBEB_LAYOUT_3F)) { // at least 1 front speaker
      return false;
    }
    if (!even(layout & (CHANNEL_FRONT_LEFT |
                        CHANNEL_FRONT_RIGHT))) { // no asymetric front
      return false;
    }
    if (!even(layout &
              (CHANNEL_SIDE_LEFT | CHANNEL_SIDE_RIGHT))) { // no asymetric side
      return false;
    }
    if (!even(layout & (CHANNEL_BACK_LEFT | CHANNEL_BACK_RIGHT))) {
      return false;
    }
    if (!even(layout &
              (CHANNEL_FRONT_LEFT_OF_CENTER | CHANNEL_FRONT_RIGHT_OF_CENTER))) {
      return false;
    }
    if (cubeb_channel_layout_nb_channels(layout) >= CHANNELS_MAX) {
      return false;
    }
    return true;
  }